

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool __thiscall
tinyusdz::GPrim::get_displayOpacity
          (GPrim *this,float *dst,double t,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  allocator local_391;
  string local_390;
  undefined1 local_370 [8];
  string err;
  GeomPrimvar primvar;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  float *dst_local;
  GPrim *this_local;
  
  GeomPrimvar::GeomPrimvar((GeomPrimvar *)((long)&err.field_2 + 8));
  std::__cxx11::string::string((string *)local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,"displayOpacity",&local_391);
  bVar1 = get_primvar(this,&local_390,(GeomPrimvar *)((long)&err.field_2 + 8),(string *)local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_local._7_1_ =
         GeomPrimvar::get_value<float>((GeomPrimvar *)((long)&err.field_2 + 8),dst,(string *)0x0);
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_370);
  GeomPrimvar::~GeomPrimvar((GeomPrimvar *)((long)&err.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool GPrim::get_displayOpacity(float *dst, double t, const value::TimeSampleInterpolationType tinterp) const
{
  // TODO: timeSamples
  (void)t;
  (void)tinterp;

  GeomPrimvar primvar;
  std::string err;
  if (!get_primvar("displayOpacity", &primvar, &err)) {
    // TODO: report err
    return false;
  }

  return primvar.get_value(dst);
}